

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error cio_uart_set_num_stop_bits(cio_uart *port,cio_uart_num_stop_bits num_stop_bits)

{
  cio_error cVar1;
  termios tty;
  
  if (port == (cio_uart *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  cVar1 = get_current_settings(port,&tty);
  if (cVar1 == CIO_SUCCESS) {
    if (num_stop_bits == CIO_UART_TWO_STOP_BITS) {
      tty.c_cflag._0_1_ = (byte)tty.c_cflag | 0x40;
    }
    else {
      if (num_stop_bits != CIO_UART_ONE_STOP_BIT) {
        return CIO_INVALID_ARGUMENT;
      }
      tty.c_cflag._0_1_ = (byte)tty.c_cflag & 0xbf;
    }
    cVar1 = set_termios((port->impl).ev.fd,&tty);
  }
  return cVar1;
}

Assistant:

enum cio_error cio_uart_set_num_stop_bits(const struct cio_uart *port, enum cio_uart_num_stop_bits num_stop_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (num_stop_bits) {
	case CIO_UART_ONE_STOP_BIT:
		tty.c_cflag &= ~(tcflag_t)CSTOPB;
		break;

	case CIO_UART_TWO_STOP_BITS:
		tty.c_cflag |= (tcflag_t)CSTOPB;
		break;

	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}